

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O0

RPCHelpMan * getrawtransaction(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffde38;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar2;
  allocator<RPCResult> *paVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffde40;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffde48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffde50;
  RPCResults *in_stack_ffffffffffffde60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffde68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffde70;
  UniValue *in_stack_ffffffffffffde78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffde80;
  undefined7 in_stack_ffffffffffffde88;
  undefined1 in_stack_ffffffffffffde8f;
  string *in_stack_ffffffffffffde90;
  undefined7 in_stack_ffffffffffffde98;
  undefined1 in_stack_ffffffffffffde9f;
  undefined4 in_stack_ffffffffffffdea0;
  Type in_stack_ffffffffffffdea4;
  string *in_stack_ffffffffffffdea8;
  undefined4 in_stack_ffffffffffffdeb0;
  Type in_stack_ffffffffffffdeb4;
  undefined4 in_stack_ffffffffffffdeb8;
  Type in_stack_ffffffffffffdebc;
  RPCResult *in_stack_ffffffffffffdec0;
  undefined1 *local_2090;
  RPCExamples *in_stack_ffffffffffffdf80;
  undefined1 *puVar4;
  RPCResults *in_stack_ffffffffffffdf88;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffdf90;
  string *in_stack_ffffffffffffdf98;
  string *in_stack_ffffffffffffdfa0;
  RPCHelpMan *in_stack_ffffffffffffdfa8;
  undefined1 *local_2048;
  undefined1 *local_2030;
  undefined1 *local_2018;
  undefined1 *local_2000;
  RPCMethodImpl *fun;
  undefined1 local_1c18 [33];
  allocator<char> local_1bf7;
  allocator<char> local_1bf6;
  allocator<char> local_1bf5;
  allocator<char> local_1bf4;
  allocator<char> local_1bf3;
  allocator<char> local_1bf2;
  allocator<char> local_1bf1;
  allocator<char> local_1bf0;
  allocator<char> local_1bef;
  allocator<char> local_1bee;
  allocator<char> local_1bed [35];
  allocator<char> local_1bca;
  RPCMethodImpl local_1bc9;
  allocator<char> local_1ba9 [31];
  allocator<char> local_1b8a;
  allocator<char> local_1b89 [9];
  undefined8 uStack_1b80;
  _Alloc_hider local_1b78;
  allocator<char> local_1b6a;
  allocator<char> local_1b69 [31];
  allocator<char> local_1b4a;
  allocator<char> local_1b49;
  size_type local_1b48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b40;
  allocator<char> local_1b2a;
  allocator<char> local_1b29 [31];
  allocator<char> local_1b0a;
  allocator<char> local_1b09 [31];
  allocator<char> local_1aea;
  allocator<char> local_1ae9;
  undefined8 local_1ae8;
  undefined8 uStack_1ae0;
  undefined8 local_1ad8;
  allocator<char> local_1ac9;
  undefined8 local_1ac8;
  undefined8 uStack_1ac0;
  undefined8 local_1ab8;
  allocator<char> local_1aaa;
  allocator<char> local_1aa9 [29];
  allocator<char> local_1a8c;
  allocator<char> local_1a8b;
  allocator<char> local_1a8a;
  allocator<char> local_1a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1a88;
  undefined8 local_1a68;
  undefined8 uStack_1a60;
  undefined8 local_1a58;
  allocator<char> local_1a4a;
  allocator<char> local_1a49;
  undefined8 local_1a48;
  undefined8 uStack_1a40;
  undefined8 local_1a38;
  allocator<char> local_1a2a;
  allocator<char> local_1a29;
  undefined8 local_1a28;
  undefined8 uStack_1a20;
  undefined8 local_1a18;
  allocator<char> local_1a09;
  undefined8 local_1a08;
  undefined8 uStack_1a00;
  undefined8 local_19f8;
  allocator<char> local_19ea;
  allocator<char> local_19e9;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  allocator<char> local_19ca;
  allocator<char> local_19c9;
  undefined8 local_19c8;
  undefined8 uStack_19c0;
  undefined8 local_19b8;
  allocator<char> local_19a2;
  allocator<char> local_19a1 [54];
  allocator<char> local_196b;
  allocator<char> local_196a;
  allocator<char> local_1969;
  undefined8 local_1968;
  undefined8 uStack_1960;
  undefined8 local_1958;
  allocator<char> local_1943;
  allocator<char> local_1942;
  allocator<char> local_1941 [32];
  allocator<char> local_1921;
  undefined4 local_1920;
  allocator<char> local_191a;
  allocator<char> local_1919;
  undefined4 local_1918;
  allocator<char> local_1912;
  allocator<char> local_1911;
  undefined4 local_1910;
  allocator<char> local_1909 [31];
  allocator<char> local_18ea;
  allocator<char> local_18e9 [1025];
  undefined1 local_14e8 [544];
  undefined1 local_12c8 [128];
  undefined1 local_1248 [272];
  undefined1 local_1138 [64];
  undefined1 local_10f8 [136];
  undefined1 local_1070 [112];
  undefined8 local_1000;
  undefined1 local_f90 [408];
  undefined1 local_df8 [96];
  string local_d98 [13];
  undefined1 local_bf8 [816];
  undefined1 local_8c8 [192];
  undefined1 local_808 [408];
  undefined1 local_670 [40];
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined1 local_630;
  undefined1 local_62f;
  undefined1 local_588;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined1 local_548;
  undefined1 local_547;
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360 [792];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1910 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffde48,&in_stack_ffffffffffffde40->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffde50);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffde38);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
                 in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
                 in_stack_ffffffffffffde90,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1918 = 0;
  UniValue::UniValue<int,_int,_true>(in_stack_ffffffffffffde78,(int *)in_stack_ffffffffffffde70);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffde48,in_stack_ffffffffffffde40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_588 = 1;
  std::__cxx11::string::string(in_stack_ffffffffffffde50);
  local_560 = 0;
  uStack_558 = 0;
  local_550 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffde38);
  local_548 = 0;
  local_547 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
                 in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
                 in_stack_ffffffffffffde90,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1920 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffde48,&in_stack_ffffffffffffde40->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_670[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffde50);
  local_648 = 0;
  uStack_640 = 0;
  local_638 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffde38);
  local_630 = 0;
  local_62f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
                 in_stack_ffffffffffffdea8,in_stack_ffffffffffffdea4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
                 in_stack_ffffffffffffde90,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffde38);
  __l._M_len._0_7_ = in_stack_ffffffffffffde88;
  __l._M_array = (iterator)in_stack_ffffffffffffde80;
  __l._M_len._7_1_ = in_stack_ffffffffffffde8f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffde78,__l,
             (allocator_type *)in_stack_ffffffffffffde70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1968 = 0;
  uStack_1960 = 0;
  local_1958 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde38);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,
             (string *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             (string *)CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_19c8 = 0;
  uStack_19c0 = 0;
  local_19b8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde38);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)
           ((ulong)in_stack_ffffffffffffde38 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_19e8 = 0;
  uStack_19e0 = 0;
  local_19d8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1a08 = 0;
  uStack_1a00 = 0;
  local_19f8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
                 in_stack_ffffffffffffde80);
  local_1a28 = 0;
  uStack_1a20 = 0;
  local_1a18 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  pvVar2 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1a48 = 0;
  uStack_1a40 = 0;
  local_1a38 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar2);
  paVar3 = (allocator<RPCResult> *)((ulong)pvVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1a68 = 0;
  uStack_1a60 = 0;
  local_1a58 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffde88;
  __l_00._M_array = (iterator)in_stack_ffffffffffffde80;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffde8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde78,__l_00,
             (allocator_type *)in_stack_ffffffffffffde70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  DecodeTxDoc(&local_1a88,local_d98);
  Cat<std::vector<RPCResult,std::allocator<RPCResult>>>
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde70,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde68);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,
             (string *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             (string *)CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1ac8 = 0;
  uStack_1ac0 = 0;
  local_1ab8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
                 in_stack_ffffffffffffde80);
  std::operator+(in_stack_ffffffffffffde50,(char *)in_stack_ffffffffffffde48);
  local_1ae8 = 0;
  uStack_1ae0 = 0;
  local_1ad8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1b48 = 0;
  aStack_1b40._M_allocated_capacity = 0;
  aStack_1b40._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1b89[1] = (allocator<char>)0x0;
  local_1b89[2] = (allocator<char>)0x0;
  local_1b89[3] = (allocator<char>)0x0;
  local_1b89[4] = (allocator<char>)0x0;
  local_1b89[5] = (allocator<char>)0x0;
  local_1b89[6] = (allocator<char>)0x0;
  local_1b89[7] = (allocator<char>)0x0;
  local_1b89[8] = (allocator<char>)0x0;
  uStack_1b80._0_1_ = '\0';
  uStack_1b80._1_7_ = 0;
  local_1b78._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  local_1ba9[1] = (allocator<char>)0x0;
  local_1ba9[2] = (allocator<char>)0x0;
  local_1ba9[3] = (allocator<char>)0x0;
  local_1ba9[4] = (allocator<char>)0x0;
  local_1ba9[5] = (allocator<char>)0x0;
  local_1ba9[6] = (allocator<char>)0x0;
  local_1ba9[7] = (allocator<char>)0x0;
  local_1ba9[8] = (allocator<char>)0x0;
  local_1ba9[9] = (allocator<char>)0x0;
  local_1ba9[10] = (allocator<char>)0x0;
  local_1ba9[0xb] = (allocator<char>)0x0;
  local_1ba9[0xc] = (allocator<char>)0x0;
  local_1ba9[0xd] = (allocator<char>)0x0;
  local_1ba9[0xe] = (allocator<char>)0x0;
  local_1ba9[0xf] = (allocator<char>)0x0;
  local_1ba9[0x10] = (allocator<char>)0x0;
  local_1ba9[0x11] = (allocator<char>)0x0;
  local_1ba9[0x12] = (allocator<char>)0x0;
  local_1ba9[0x13] = (allocator<char>)0x0;
  local_1ba9[0x14] = (allocator<char>)0x0;
  local_1ba9[0x15] = (allocator<char>)0x0;
  local_1ba9[0x16] = (allocator<char>)0x0;
  local_1ba9[0x17] = (allocator<char>)0x0;
  local_1ba9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::operator+((char *)CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
                 in_stack_ffffffffffffde80);
  local_1bc9.super__Function_base._M_functor._1_8_ = 0;
  local_1bc9.super__Function_base._9_8_ = 0;
  local_1bc9._17_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar3);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  fun = &local_1bc9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  ScriptPubKeyDoc();
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffde88;
  __l_01._M_array = (iterator)in_stack_ffffffffffffde80;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffde8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde78,__l_01,
             (allocator_type *)in_stack_ffffffffffffde70);
  paVar3 = (allocator<RPCResult> *)((ulong)paVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             SUB41(in_stack_ffffffffffffdea4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde90,
             (bool)in_stack_ffffffffffffde8f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffde88;
  __l_02._M_array = (iterator)in_stack_ffffffffffffde80;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffde8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde78,__l_02,
             (allocator_type *)in_stack_ffffffffffffde70);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffde88;
  __l_03._M_array = (iterator)in_stack_ffffffffffffde80;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffde8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde78,__l_03,
             (allocator_type *)in_stack_ffffffffffffde70);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,in_stack_ffffffffffffdebc,
             (string *)CONCAT44(in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdeb0),
             in_stack_ffffffffffffdea8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (bool)in_stack_ffffffffffffde9f);
  std::allocator<RPCResult>::allocator(paVar3);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffde88;
  __l_04._M_array = (iterator)in_stack_ffffffffffffde80;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffde8f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde78,__l_04,
             (allocator_type *)in_stack_ffffffffffffde70);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdec0,
             (string *)CONCAT44(in_stack_ffffffffffffdebc,in_stack_ffffffffffffdeb8),
             in_stack_ffffffffffffdeb4,in_stack_ffffffffffffdea8,
             (string *)CONCAT44(in_stack_ffffffffffffdea4,in_stack_ffffffffffffdea0),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffde9f,in_stack_ffffffffffffde98));
  results._M_len._0_7_ = in_stack_ffffffffffffde88;
  results._M_array = (iterator)in_stack_ffffffffffffde80;
  results._M_len._7_1_ = in_stack_ffffffffffffde8f;
  RPCResults::RPCResults(in_stack_ffffffffffffde60,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  HelpExampleCli(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  HelpExampleCli(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::operator+(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  HelpExampleRpc(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::operator+(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  HelpExampleCli(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::operator+(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  HelpExampleCli(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::operator+(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffde8f,in_stack_ffffffffffffde88),
             (char *)in_stack_ffffffffffffde80,(allocator<char> *)in_stack_ffffffffffffde78);
  HelpExampleCli(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  std::operator+(in_stack_ffffffffffffde70,in_stack_ffffffffffffde68);
  RPCExamples::RPCExamples((RPCExamples *)paVar3,(string *)0x139cad3);
  this = (RPCArg *)local_1c18;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getrawtransaction()::__0,void>
            (in_stack_ffffffffffffde48,(anon_class_1_0_00000001 *)in_stack_ffffffffffffde40);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffdfa8,in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf98,
             in_stack_ffffffffffffdf90,in_stack_ffffffffffffdf88,in_stack_ffffffffffffdf80,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1c18 + 0x20));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf7);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf6);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf5);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf4);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf3);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf1);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bf0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bef);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bee);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1bed);
  RPCResults::~RPCResults((RPCResults *)this);
  local_2000 = local_670;
  do {
    local_2000 = local_2000 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2000 != local_808);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2018 = local_df8;
  do {
    local_2018 = local_2018 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2018 != local_f90);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2030 = local_1070;
  do {
    local_2030 = local_2030 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2030 != local_10f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_2048 = local_1138;
  do {
    local_2048 = local_2048 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2048 != local_1248);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_14e8;
  puVar1 = local_12c8;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1bca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1ba9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b8a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1b89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b6a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1b69);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1b29);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1b0a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1b09);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1aea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ae9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1ac9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1aaa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1aa9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a8c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a8b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a8a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a89);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar4 = local_bf8;
  puVar1 = local_8c8;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a4a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a49);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a2a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a29);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1a09);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19c9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_19a2);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_19a1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_196b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_196a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1969);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffde48);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1943);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1942);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1941);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffde48);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_2090 = local_48;
  do {
    local_2090 = local_2090 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_2090 != local_360);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1921);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_191a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1919);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1912);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_1911);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1909);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_18ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_18e9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getrawtransaction()
{
    return RPCHelpMan{
                "getrawtransaction",

                "By default, this call only returns a transaction if it is in the mempool. If -txindex is enabled\n"
                "and no blockhash argument is passed, it will return the transaction if it is in the mempool or any block.\n"
                "If a blockhash argument is passed, it will return the transaction if\n"
                "the specified block is available and the transaction is in that block.\n\n"
                "Hint: Use gettransaction for wallet transactions.\n\n"

                "If verbosity is 0 or omitted, returns the serialized transaction as a hex-encoded string.\n"
                "If verbosity is 1, returns a JSON Object with information about the transaction.\n"
                "If verbosity is 2, returns a JSON Object with information about the transaction, including fee and prevout information.",
                {
                    {"txid", RPCArg::Type::STR_HEX, RPCArg::Optional::NO, "The transaction id"},
                    {"verbosity|verbose", RPCArg::Type::NUM, RPCArg::Default{0}, "0 for hex-encoded data, 1 for a JSON object, and 2 for JSON object with fee and prevout",
                     RPCArgOptions{.skip_type_check = true}},
                    {"blockhash", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "The block in which to look for the transaction"},
                },
                {
                    RPCResult{"if verbosity is not set or set to 0",
                         RPCResult::Type::STR, "data", "The serialized transaction as a hex-encoded string for 'txid'"
                     },
                     RPCResult{"if verbosity is set to 1",
                         RPCResult::Type::OBJ, "", "",
                         Cat<std::vector<RPCResult>>(
                         {
                             {RPCResult::Type::BOOL, "in_active_chain", /*optional=*/true, "Whether specified block is in the active chain or not (only present with explicit \"blockhash\" argument)"},
                             {RPCResult::Type::STR_HEX, "blockhash", /*optional=*/true, "the block hash"},
                             {RPCResult::Type::NUM, "confirmations", /*optional=*/true, "The confirmations"},
                             {RPCResult::Type::NUM_TIME, "blocktime", /*optional=*/true, "The block time expressed in " + UNIX_EPOCH_TIME},
                             {RPCResult::Type::NUM, "time", /*optional=*/true, "Same as \"blocktime\""},
                             {RPCResult::Type::STR_HEX, "hex", "The serialized, hex-encoded data for 'txid'"},
                         },
                         DecodeTxDoc(/*txid_field_doc=*/"The transaction id (same as provided)")),
                    },
                    RPCResult{"for verbosity = 2",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                            {RPCResult::Type::NUM, "fee", /*optional=*/true, "transaction fee in " + CURRENCY_UNIT + ", omitted if block undo data is not available"},
                            {RPCResult::Type::ARR, "vin", "",
                            {
                                {RPCResult::Type::OBJ, "", "utxo being spent",
                                {
                                    {RPCResult::Type::ELISION, "", "Same output as verbosity = 1"},
                                    {RPCResult::Type::OBJ, "prevout", /*optional=*/true, "The previous output, omitted if block undo data is not available",
                                    {
                                        {RPCResult::Type::BOOL, "generated", "Coinbase or not"},
                                        {RPCResult::Type::NUM, "height", "The height of the prevout"},
                                        {RPCResult::Type::STR_AMOUNT, "value", "The value in " + CURRENCY_UNIT},
                                        {RPCResult::Type::OBJ, "scriptPubKey", "", ScriptPubKeyDoc()},
                                    }},
                                }},
                            }},
                        }},
                },
                RPCExamples{
                    HelpExampleCli("getrawtransaction", "\"mytxid\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 1")
            + HelpExampleRpc("getrawtransaction", "\"mytxid\", 1")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 0 \"myblockhash\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 1 \"myblockhash\"")
            + HelpExampleCli("getrawtransaction", "\"mytxid\" 2 \"myblockhash\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const NodeContext& node = EnsureAnyNodeContext(request.context);
    ChainstateManager& chainman = EnsureChainman(node);

    uint256 hash = ParseHashV(request.params[0], "parameter 1");
    const CBlockIndex* blockindex = nullptr;

    if (hash == chainman.GetParams().GenesisBlock().hashMerkleRoot) {
        // Special exception for the genesis block coinbase transaction
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "The genesis block coinbase is not considered an ordinary transaction and cannot be retrieved");
    }

    // Accept either a bool (true) or a num (>=0) to indicate verbosity.
    int verbosity{0};
    if (!request.params[1].isNull()) {
        if (request.params[1].isBool()) {
            verbosity = request.params[1].get_bool();
        } else {
            verbosity = request.params[1].getInt<int>();
        }
    }

    if (!request.params[2].isNull()) {
        LOCK(cs_main);

        uint256 blockhash = ParseHashV(request.params[2], "parameter 3");
        blockindex = chainman.m_blockman.LookupBlockIndex(blockhash);
        if (!blockindex) {
            throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Block hash not found");
        }
    }

    bool f_txindex_ready = false;
    if (g_txindex && !blockindex) {
        f_txindex_ready = g_txindex->BlockUntilSyncedToCurrentChain();
    }

    uint256 hash_block;
    const CTransactionRef tx = GetTransaction(blockindex, node.mempool.get(), hash, hash_block, chainman.m_blockman);
    if (!tx) {
        std::string errmsg;
        if (blockindex) {
            const bool block_has_data = WITH_LOCK(::cs_main, return blockindex->nStatus & BLOCK_HAVE_DATA);
            if (!block_has_data) {
                throw JSONRPCError(RPC_MISC_ERROR, "Block not available");
            }
            errmsg = "No such transaction found in the provided block";
        } else if (!g_txindex) {
            errmsg = "No such mempool transaction. Use -txindex or provide a block hash to enable blockchain transaction queries";
        } else if (!f_txindex_ready) {
            errmsg = "No such mempool transaction. Blockchain transactions are still in the process of being indexed";
        } else {
            errmsg = "No such mempool or blockchain transaction";
        }
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, errmsg + ". Use gettransaction for wallet transactions.");
    }

    if (verbosity <= 0) {
        return EncodeHexTx(*tx);
    }

    UniValue result(UniValue::VOBJ);
    if (blockindex) {
        LOCK(cs_main);
        result.pushKV("in_active_chain", chainman.ActiveChain().Contains(blockindex));
    }
    // If request is verbosity >= 1 but no blockhash was given, then look up the blockindex
    if (request.params[2].isNull()) {
        LOCK(cs_main);
        blockindex = chainman.m_blockman.LookupBlockIndex(hash_block); // May be nullptr for mempool transactions
    }
    if (verbosity == 1) {
        TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate());
        return result;
    }

    CBlockUndo blockUndo;
    CBlock block;

    if (tx->IsCoinBase() || !blockindex || WITH_LOCK(::cs_main, return !(blockindex->nStatus & BLOCK_HAVE_MASK))) {
        TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate());
        return result;
    }
    if (!chainman.m_blockman.UndoReadFromDisk(blockUndo, *blockindex)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Undo data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
    }
    if (!chainman.m_blockman.ReadBlockFromDisk(block, *blockindex)) {
        throw JSONRPCError(RPC_INTERNAL_ERROR, "Block data expected but can't be read. This could be due to disk corruption or a conflict with a pruning event.");
    }

    CTxUndo* undoTX {nullptr};
    auto it = std::find_if(block.vtx.begin(), block.vtx.end(), [tx](CTransactionRef t){ return *t == *tx; });
    if (it != block.vtx.end()) {
        // -1 as blockundo does not have coinbase tx
        undoTX = &blockUndo.vtxundo.at(it - block.vtx.begin() - 1);
    }
    TxToJSON(*tx, hash_block, result, chainman.ActiveChainstate(), undoTX, TxVerbosity::SHOW_DETAILS_AND_PREVOUT);
    return result;
},
    };
}